

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O0

int __thiscall cmCPackSTGZGenerator::InitializeInternal(cmCPackSTGZGenerator *this)

{
  cmCPackLog *this_00;
  ulong uVar1;
  ostream *poVar2;
  char *pcVar3;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  undefined4 local_20c;
  string local_208 [32];
  undefined1 local_1e8 [8];
  ostringstream cmCPackLog_msg;
  string local_70 [8];
  string inFile;
  allocator local_39;
  string local_38;
  cmCPackSTGZGenerator *local_18;
  cmCPackSTGZGenerator *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",&local_39);
  cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,&local_38,"0");
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (*(this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
    super_cmObject._vptr_cmObject[0xd])(local_70,this,"CPack.STGZ_Header.sh.in");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"CPACK_STGZ_HEADER_FILE",&local_231);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,&local_230,pcVar3);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_258,"CPACK_AT_SIGN",&local_259);
    cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,&local_258,"@");
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    this_local._4_4_ = cmCPackArchiveGenerator::InitializeInternal((cmCPackArchiveGenerator *)this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar2 = std::operator<<((ostream *)local_1e8,"Cannot find template file: ");
    poVar2 = std::operator<<(poVar2,local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator
              .Logger;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                    ,0x2c,pcVar3);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    this_local._4_4_ = 0;
  }
  local_20c = 1;
  std::__cxx11::string::~string(local_70);
  return this_local._4_4_;
}

Assistant:

int cmCPackSTGZGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "0");

  std::string inFile = this->FindTemplate("CPack.STGZ_Header.sh.in");
  if ( inFile.empty() )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Cannot find template file: "
      << inFile << std::endl);
    return 0;
    }
  this->SetOptionIfNotSet("CPACK_STGZ_HEADER_FILE", inFile.c_str());
  this->SetOptionIfNotSet("CPACK_AT_SIGN", "@");

  return this->Superclass::InitializeInternal();
}